

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string *message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  string *psVar5;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)&local_70);
  psVar5 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  paVar1 = &local_50.field_2;
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  HeadLine(&local_90,&local_50);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  paVar2 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)(message->_M_dataplus)._M_p);
  if (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_70);
  }
  std::__cxx11::string::push_back((char)&local_70);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Command","");
  HeadLine(&local_90,&local_50);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmQtAutoGen::QuotedCommand(&local_90,command);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_70);
  }
  std::__cxx11::string::push_back((char)&local_70);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Output","");
  HeadLine(&local_90,&local_50);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)(output->_M_dataplus)._M_p);
  if (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_70);
  }
  std::__cxx11::string::push_back((char)&local_70);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    cmSystemTools::Stderr(&local_70);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, std::string const& message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg;
  msg.push_back('\n');
  msg += HeadLine(GeneratorName(genType) + " subprocess error");
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Command");
  msg += QuotedCommand(command);
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Output");
  msg += output;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}